

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lss_allocator.cc
# Opt level: O0

void * __thiscall
FASTER::core::lss_memory::ThreadAllocator::AllocateAligned
          (ThreadAllocator *this,uint32_t size,uint32_t alignment)

{
  uint32_t uVar1;
  uint uVar2;
  SegmentAllocator *pSVar3;
  size_t sVar4;
  uint8_t *puVar5;
  size_t sVar6;
  Header *header;
  uint32_t offset;
  uint32_t user_offset;
  uint8_t *buffer;
  uint32_t block_offset;
  uint32_t block_size;
  uint32_t alignment_local;
  uint32_t size_local;
  ThreadAllocator *this_local;
  
  if (this->segment_allocator_ == (SegmentAllocator *)0x0) {
    pSVar3 = (SegmentAllocator *)aligned_alloc(0x40,0x1f50);
    this->segment_allocator_ = pSVar3;
    if (this->segment_allocator_ == (SegmentAllocator *)0x0) {
      return (void *)0x0;
    }
    SegmentAllocator::SegmentAllocator(this->segment_allocator_);
  }
  if (0xf < alignment) {
    if ((alignment & alignment - 1) != 0) {
      __assert_fail("(alignment & (alignment - 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/epoch/faster/lss_allocator.cc"
                    ,0x6a,
                    "void *FASTER::core::lss_memory::ThreadAllocator::AllocateAligned(uint32_t, uint32_t)"
                   );
    }
    sVar4 = pad_alignment(((ulong)size + (ulong)alignment) - 0xe,0x10);
    uVar1 = Reserve(this,(uint32_t)sVar4);
    if (this->segment_offset_ < 0x1f41) {
      puVar5 = this->segment_allocator_->buffer;
      sVar6 = pad_alignment((size_t)(puVar5 + (ulong)uVar1 + 2),(ulong)alignment);
      uVar2 = ((int)sVar6 - ((int)puVar5 + uVar1)) - 2;
      if ((sVar4 & 0xffffffff) < (ulong)uVar2 + 2 + (ulong)size) {
        __assert_fail("user_offset + sizeof(Header) + size <= block_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/epoch/faster/lss_allocator.cc"
                      ,0x7c,
                      "void *FASTER::core::lss_memory::ThreadAllocator::AllocateAligned(uint32_t, uint32_t)"
                     );
      }
      uVar2 = uVar1 + uVar2;
      Header::Header((Header *)(puVar5 + uVar2),(uint16_t)uVar2);
      this_local = (ThreadAllocator *)(puVar5 + uVar2 + 2);
    }
    else {
      SegmentAllocator::Seal(this->segment_allocator_,this->allocations_);
      this->segment_allocator_ = (SegmentAllocator *)0x0;
      this->allocations_ = 0;
      this->segment_offset_ = 0;
      this_local = (ThreadAllocator *)AllocateAligned(this,size,alignment);
    }
    return this_local;
  }
  __assert_fail("alignment >= kBaseAlignment",
                "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/epoch/faster/lss_allocator.cc"
                ,0x69,
                "void *FASTER::core::lss_memory::ThreadAllocator::AllocateAligned(uint32_t, uint32_t)"
               );
}

Assistant:

void* ThreadAllocator::AllocateAligned(uint32_t size, uint32_t alignment) {
  if(!segment_allocator_) {
    segment_allocator_ = reinterpret_cast<SegmentAllocator*>(aligned_alloc(kCacheLineSize,
                         sizeof(SegmentAllocator)));
    if(!segment_allocator_) {
      return nullptr;
    }
    new(segment_allocator_) SegmentAllocator{};
  }
  // Alignment must be >= base alignment, and a power of 2.
  assert(alignment >= kBaseAlignment);
  assert((alignment & (alignment - 1)) == 0);
  // Block needs to be large enough to hold the user block, the header, and the align land fill.
  // Max align land fill size is (alignment - kBaseAlignment).
  uint32_t block_size = static_cast<uint32_t>(pad_alignment(
                          size + sizeof(Header) + alignment - kBaseAlignment,
                          kBaseAlignment));
  uint32_t block_offset = Reserve(block_size);
  if(segment_offset_ <= kSegmentSize) {
    // The allocation succeeded inside the active segment.
    uint8_t* buffer = segment_allocator_->buffer;
#ifdef _DEBUG
    //  - 0xEA - align land fill.
    ::memset(&buffer[block_offset], 0xEA, block_size);
#endif
    // Align the user block.
    uint32_t user_offset = static_cast<uint32_t>(pad_alignment(reinterpret_cast<size_t>(
                             &buffer[block_offset]) + sizeof(Header), alignment) -
                           reinterpret_cast<size_t>(&buffer[block_offset]) - sizeof(Header));
    assert(user_offset + sizeof(Header) + size <= block_size);
    uint32_t offset = block_offset + user_offset;
#ifdef _DEBUG
    //  - 0xCA - allocated.
    ::memset(&buffer[offset], 0xCA, size + sizeof(Header));
#endif
    Header* header = reinterpret_cast<Header*>(&buffer[offset]);
#ifdef _DEBUG
    new(header) Header(size, offset);
#else
    new(header) Header(offset);
#endif
    return header + 1;
  } else {
    // We filled the active segment; seal it.
    segment_allocator_->Seal(allocations_);
    segment_allocator_ = nullptr;
    allocations_ = 0;
    segment_offset_ = 0;
    // Call self recursively, to allocate inside a new segment.
    return AllocateAligned(size, alignment);
  }
}